

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallBuffer.hpp
# Opt level: O3

SmallBuffer * __thiscall helics::SmallBuffer::operator=(SmallBuffer *this,SmallBuffer *sb)

{
  byte *pbVar1;
  size_t sVar2;
  bool bVar3;
  SmallBuffer *pSVar4;
  bool bVar5;
  
  if (this->locked == true) {
    if (this == sb) {
      return this;
    }
    sVar2 = sb->bufferSize;
    reserve(this,sVar2);
    this->bufferSize = sVar2;
    memcpy(this->heap,sb->heap,sb->bufferSize);
    return this;
  }
  if (this->usingAllocatedBuffer == true) {
    pbVar1 = this->heap;
    if (this->nonOwning == true) {
      if (sb->heap == pbVar1) {
        sVar2 = sb->bufferCapacity;
        this->bufferSize = sb->bufferSize;
        this->bufferCapacity = sVar2;
        return this;
      }
    }
    else {
      if (sb->heap == pbVar1) {
        this->bufferSize = sb->bufferSize;
        return this;
      }
      if (pbVar1 != (byte *)0x0) {
        operator_delete__(pbVar1);
      }
    }
  }
  bVar5 = sb->usingAllocatedBuffer != true;
  if (bVar5) {
    memcpy(this,(SmallBuffer *)sb->heap,sb->bufferSize);
    sVar2 = 0x40;
    bVar3 = false;
    pSVar4 = this;
  }
  else {
    sVar2 = sb->bufferCapacity;
    bVar3 = sb->nonOwning;
    pSVar4 = (SmallBuffer *)sb->heap;
  }
  this->heap = (byte *)pSVar4;
  this->bufferCapacity = sVar2;
  this->usingAllocatedBuffer = !bVar5;
  this->nonOwning = bVar3;
  this->locked = sb->locked;
  this->bufferSize = sb->bufferSize;
  sb->heap = (byte *)sb;
  sb->bufferCapacity = 0x40;
  sb->bufferSize = 0;
  sb->locked = false;
  sb->usingAllocatedBuffer = false;
  return this;
}

Assistant:

SmallBuffer& operator=(SmallBuffer&& sb) noexcept
    {
        if (locked) {
            // if locked then use the copy operation not move
            const SmallBuffer& buf = sb;
            try {
                return operator=(buf);
            }
            catch (std::bad_alloc&) {
                errorCondition = 2;
                return *this;
            }
        }
        if (usingAllocatedBuffer) {
            if (nonOwning) {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    bufferCapacity = sb.bufferCapacity;
                    return *this;
                }
            } else {
                if (sb.heap == heap) {
                    bufferSize = sb.bufferSize;
                    return *this;
                }
                delete[] heap;
            }
        }

        if (sb.usingAllocatedBuffer) {
            heap = sb.heap;
            bufferCapacity = sb.bufferCapacity;
            usingAllocatedBuffer = true;
            nonOwning = sb.nonOwning;
        } else {
            std::memcpy(buffer.data(), sb.heap, sb.bufferSize);
            usingAllocatedBuffer = false;
            nonOwning = false;
            heap = buffer.data();
            bufferCapacity = 64;
        }
        locked = sb.locked;
        bufferSize = sb.bufferSize;
        sb.heap = sb.buffer.data();
        sb.bufferCapacity = 64;
        sb.bufferSize = 0;
        sb.usingAllocatedBuffer = false;
        sb.locked = false;

        return *this;
    }